

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O2

void * dac_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  _gobj *p_Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  t_float tVar5;
  t_atom defarg [2];
  
  owner = (t_object *)pd_new(dac_class);
  if (argc == 0) {
    defarg[0].a_type = A_FLOAT;
    defarg[0].a_w.w_index = 0x3f800000;
    defarg[1].a_w.w_index = 0x40000000;
    argc = 2;
    argv = defarg;
    defarg[1].a_type = defarg[0].a_type;
  }
  iVar2 = 1;
  owner[1].te_g.g_pd = (t_pd)(long)argc;
  p_Var1 = (_gobj *)getbytes((long)argc * 8);
  owner[1].te_g.g_next = p_Var1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < argc) {
    uVar3 = (ulong)(uint)argc;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    tVar5 = atom_getfloatarg((int)uVar4,argc,argv);
    (&(owner[1].te_g.g_next)->g_pd)[uVar4] = (t_pd)(long)tVar5;
  }
  for (; iVar2 < argc; iVar2 = iVar2 + 1) {
    inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  }
  *(undefined4 *)&owner[1].te_binbuf = 0;
  return owner;
}

Assistant:

static void *dac_new(t_symbol *s, int argc, t_atom *argv)
{
    t_dac *x = (t_dac *)pd_new(dac_class);
    t_atom defarg[2];
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 1);
        SETFLOAT(&defarg[1], 2);
    }
    x->x_n = argc;
    x->x_vec = (t_int *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0; i < argc; i++)
        x->x_vec[i] = atom_getfloatarg(i, argc, argv);
    for (i = 1; i < argc; i++)
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    x->x_f = 0;
    return (x);
}